

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O2

void printShiftImmOperand(MCInst *MI,uint OpNum,SStream *O)

{
  cs_detail *pcVar1;
  uint uVar2;
  undefined4 uVar3;
  MCOperand *op;
  ulong uVar4;
  undefined4 in_register_00000034;
  char *pcVar5;
  uint uVar6;
  
  op = MCInst_getOperand(MI,3);
  uVar4 = MCOperand_getImm(op);
  uVar6 = (uint)uVar4 & 0x1f;
  if ((uVar4 & 0x20) == 0) {
    if ((uVar4 & 0x1f) == 0) {
      return;
    }
    pcVar5 = ", lsl #%u";
    if (9 < uVar6) {
      pcVar5 = ", lsl #0x%x";
    }
    SStream_concat((SStream *)CONCAT44(in_register_00000034,OpNum),pcVar5,(ulong)uVar6);
    if (MI->csh->detail == CS_OPT_OFF) {
      return;
    }
    uVar3 = 2;
  }
  else {
    uVar2 = 0x20;
    if ((uVar4 & 0x1f) != 0) {
      uVar2 = uVar6;
    }
    uVar6 = uVar2;
    pcVar5 = ", asr #%u";
    if (9 < uVar6) {
      pcVar5 = ", asr #0x%x";
    }
    SStream_concat((SStream *)CONCAT44(in_register_00000034,OpNum),pcVar5,(ulong)uVar6);
    if (MI->csh->detail == CS_OPT_OFF) {
      return;
    }
    uVar3 = 1;
  }
  pcVar1 = MI->flat_insn->detail;
  *(undefined4 *)(pcVar1->groups + (ulong)(pcVar1->field_6).arm.op_count * 0x30 + 9) = uVar3;
  pcVar1 = MI->flat_insn->detail;
  *(uint *)(pcVar1->groups + (ulong)(pcVar1->field_6).arm.op_count * 0x30 + 0xd) = uVar6;
  return;
}

Assistant:

static void printShiftImmOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned ShiftOp = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	bool isASR = (ShiftOp & (1 << 5)) != 0;
	unsigned Amt = ShiftOp & 0x1f;
	if (isASR) {
		unsigned tmp = Amt == 0 ? 32 : Amt;
		if (tmp > HEX_THRESHOLD)
			SStream_concat(O, ", asr #0x%x", tmp);
		else
			SStream_concat(O, ", asr #%u", tmp);
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.type = ARM_SFT_ASR;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.value = tmp;
		}
	} else if (Amt) {
		if (Amt > HEX_THRESHOLD)
			SStream_concat(O, ", lsl #0x%x", Amt);
		else
			SStream_concat(O, ", lsl #%u", Amt);
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.type = ARM_SFT_LSL;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.value = Amt;
		}
	}
}